

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

optional<CService> *
Lookup(optional<CService> *__return_storage_ptr__,string *name,uint16_t portDefault,
      bool fAllowLookup,DNSLookupFn dns_lookup_function)

{
  long lVar1;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_R8;
  long in_FS_OFFSET;
  DNSLookupFn in_stack_ffffffffffffff98;
  vector<CService,_std::allocator<CService>_> services;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&stack0xffffffffffffff98,in_R8);
  Lookup(&services,name,portDefault,fAllowLookup,1,in_stack_ffffffffffffff98);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff98);
  if (services.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
      super__Vector_impl_data._M_start ==
      services.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
    super__Optional_payload<CService,_true,_false,_false>.super__Optional_payload_base<CService>.
    _M_engaged = false;
  }
  else {
    std::_Optional_payload_base<CService>::_Optional_payload_base<CService_const&>
              ((_Optional_payload_base<CService> *)__return_storage_ptr__);
  }
  std::vector<CService,_std::allocator<CService>_>::~vector(&services);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CService> Lookup(const std::string& name, uint16_t portDefault, bool fAllowLookup, DNSLookupFn dns_lookup_function)
{
    const std::vector<CService> services{Lookup(name, portDefault, fAllowLookup, 1, dns_lookup_function)};

    return services.empty() ? std::nullopt : std::make_optional(services.front());
}